

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O1

LY_ERR json_print_attribute(jsonpr_ctx *pctx,lyd_node_opaq *node)

{
  uint uVar1;
  lyd_attr *plVar2;
  LY_ERR in_EAX;
  char *pcVar3;
  ly_out *out;
  
  plVar2 = node->attr;
  do {
    if (plVar2 == (lyd_attr *)0x0) {
      return in_EAX;
    }
    json_print_member2(pctx,(lyd_node *)node,plVar2->format,&plVar2->name,'\0');
    uVar1 = plVar2->hints;
    if ((uVar1 & 0x1d) == 0) {
      if ((uVar1 & 0x22) == 0) {
        out = pctx->out;
        if ((uVar1 & 0x40) == 0) goto LAB_0013ee3a;
        ly_print_(out,"[null]");
      }
      else {
        pcVar3 = plVar2->value;
        if (*pcVar3 == '\0') {
          pcVar3 = "null";
        }
        ly_print_(pctx->out,"%s",pcVar3);
      }
    }
    else {
      out = pctx->out;
LAB_0013ee3a:
      json_print_string(out,plVar2->value);
    }
    in_EAX = (LY_ERR)pctx->level;
    pctx->level_printed = pctx->level;
    plVar2 = plVar2->next;
  } while( true );
}

Assistant:

static LY_ERR
json_print_attribute(struct jsonpr_ctx *pctx, const struct lyd_node_opaq *node)
{
    struct lyd_attr *attr;

    for (attr = node->attr; attr; attr = attr->next) {
        json_print_member2(pctx, &node->node, attr->format, &attr->name, 0);

        if (attr->hints & (LYD_VALHINT_STRING | LYD_VALHINT_OCTNUM | LYD_VALHINT_HEXNUM | LYD_VALHINT_NUM64)) {
            json_print_string(pctx->out, attr->value);
        } else if (attr->hints & (LYD_VALHINT_BOOLEAN | LYD_VALHINT_DECNUM)) {
            ly_print_(pctx->out, "%s", attr->value[0] ? attr->value : "null");
        } else if (attr->hints & LYD_VALHINT_EMPTY) {
            ly_print_(pctx->out, "[null]");
        } else {
            /* unknown value format with no hints, use universal string */
            json_print_string(pctx->out, attr->value);
        }
        LEVEL_PRINTED;
    }

    return LY_SUCCESS;
}